

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

string * flatbuffers::kotlin::KotlinGenerator::CastToUsigned_abi_cxx11_(Type type)

{
  undefined4 uVar1;
  allocator<char> *__a;
  char *__s;
  undefined4 uVar2;
  string *in_RDI;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  uVar1 = in_stack_0000000c;
switchD_00191079_caseD_e:
  in_stack_0000000c = uVar1;
  uVar2 = in_stack_00000008;
  in_stack_00000008 = in_stack_0000000c;
  uVar1 = 0;
  switch(uVar2) {
  case 1:
  case 4:
    __s = ".toUByte()";
    __a = &local_a;
    break;
  default:
    __s = "";
    __a = &local_d;
    break;
  case 6:
    __s = ".toUShort()";
    __a = &local_b;
    break;
  case 8:
    __s = ".toUInt()";
    __a = &local_9;
    break;
  case 10:
    __s = ".toULong()";
    __a = &local_c;
    break;
  case 0xe:
    goto switchD_00191079_caseD_e;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,__a);
  return in_RDI;
}

Assistant:

static std::string CastToUsigned(const Type type) {
    switch (type.base_type) {
      case BASE_TYPE_UINT: return ".toUInt()";
      case BASE_TYPE_UCHAR:
      case BASE_TYPE_UTYPE: return ".toUByte()";
      case BASE_TYPE_USHORT: return ".toUShort()";
      case BASE_TYPE_ULONG: return ".toULong()";
      case BASE_TYPE_VECTOR: return CastToUsigned(type.VectorType());
      default: return "";
    }
  }